

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectModel.cpp
# Opt level: O0

Oop __thiscall Lodtalk::VMContext::setGlobalVariable(VMContext *this,Oop symbol,Oop value)

{
  IdentityDictionary *this_00;
  int iVar1;
  Association *pAVar2;
  undefined1 local_60 [8];
  Ref<Lodtalk::Association> newGlobalVar;
  Association *globalVar;
  VMContext *this_local;
  Oop value_local;
  Oop symbol_local;
  
  pAVar2 = IdentityDictionary::getNativeAssociationOrNil
                     (&this->globalDictionary->super_IdentityDictionary,symbol);
  newGlobalVar.reference.nextReference_ = (OopRef *)Oop::fromPointer(pAVar2);
  iVar1 = classIndexOf((Oop)newGlobalVar.reference.nextReference_);
  if (iVar1 == 0x2c) {
    (pAVar2->value).field_0 = value.field_0;
    symbol_local = Oop::fromPointer(pAVar2);
  }
  else {
    pAVar2 = GlobalVariable::make(this,symbol,value);
    Ref<Lodtalk::Association>::Ref((Ref<Lodtalk::Association> *)local_60,this,pAVar2);
    this_00 = &this->globalDictionary->super_IdentityDictionary;
    pAVar2 = Ref<Lodtalk::Association>::get((Ref<Lodtalk::Association> *)local_60);
    IdentityDictionary::putNativeAssociation(this_00,this,pAVar2);
    symbol_local = Ref<Lodtalk::Association>::getOop((Ref<Lodtalk::Association> *)local_60);
    Ref<Lodtalk::Association>::~Ref((Ref<Lodtalk::Association> *)local_60);
  }
  return (Oop)symbol_local.field_0.pointer;
}

Assistant:

Oop VMContext::setGlobalVariable(Oop symbol, Oop value)
{
	// Set the existing value.
	auto globalVar = globalDictionary->getNativeAssociationOrNil(symbol);
	if(classIndexOf(Oop::fromPointer(globalVar)) == SCI_GlobalVariable)
	{
		globalVar->value = value;
		return Oop::fromPointer(globalVar);
	}

	// Create the global variable
	Ref<Association> newGlobalVar(this, GlobalVariable::make(this, symbol, value));
	globalDictionary->putNativeAssociation(this, newGlobalVar.get());
	return newGlobalVar.getOop();
}